

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

int debug_putchunkname(SBuf *sb,GCproto *pt,int pathstrip)

{
  GCstr *s;
  undefined1 *puVar1;
  int in_EDX;
  long in_RSI;
  uint *in_RDI;
  int i;
  MSize len;
  char *p;
  GCstr *name;
  char *p_1;
  int local_68;
  MSize in_stack_ffffffffffffff9c;
  MSize len_00;
  GCstr *sb_00;
  undefined4 in_stack_ffffffffffffffb0;
  int local_34;
  char *local_8;
  
  s = (GCstr *)(ulong)*(uint *)(in_RSI + 0x28);
  sb_00 = s + 1;
  len_00 = (MSize)((ulong)sb_00 >> 0x20);
  if (*(int *)(in_RSI + 0x2c) == -1) {
    lj_buf_putmem((SBuf *)CONCAT44(in_EDX,in_stack_ffffffffffffffb0),s,len_00);
    lj_buf_putstr((SBuf *)CONCAT44(in_EDX,in_stack_ffffffffffffffb0),s);
    if (in_RDI[1] == *in_RDI) {
      local_8 = lj_buf_more2((SBuf *)sb_00,in_stack_ffffffffffffff9c);
    }
    else {
      local_8 = (char *)(ulong)*in_RDI;
    }
    *local_8 = ']';
    *in_RDI = (int)local_8 + 1;
    local_34 = 0;
  }
  else {
    if (((char)(sb_00->nextgc).gcptr32 == '=') || ((char)(sb_00->nextgc).gcptr32 == '@')) {
      puVar1 = (undefined1 *)((long)&s[1].nextgc.gcptr32 + 1);
      if (in_EDX != 0) {
        for (local_68 = s->len - 2; -1 < local_68; local_68 = local_68 + -1) {
          if ((puVar1[local_68] == '/') || (puVar1[local_68] == '\\')) {
            puVar1 = puVar1 + (long)local_68 + 1;
            break;
          }
        }
      }
      lj_buf_putmem((SBuf *)CONCAT44(in_EDX,in_stack_ffffffffffffffb0),s,
                    (MSize)((ulong)puVar1 >> 0x20));
    }
    else {
      lj_buf_putmem((SBuf *)CONCAT44(in_EDX,in_stack_ffffffffffffffb0),s,len_00);
    }
    local_34 = 1;
  }
  return local_34;
}

Assistant:

static int debug_putchunkname(SBuf *sb, GCproto *pt, int pathstrip)
{
  GCstr *name = proto_chunkname(pt);
  const char *p = strdata(name);
  if (pt->firstline == ~(BCLine)0) {
    lj_buf_putmem(sb, "[builtin:", 9);
    lj_buf_putstr(sb, name);
    lj_buf_putb(sb, ']');
    return 0;
  }
  if (*p == '=' || *p == '@') {
    MSize len = name->len-1;
    p++;
    if (pathstrip) {
      int i;
      for (i = len-1; i >= 0; i--)
	if (p[i] == '/' || p[i] == '\\') {
	  len -= i+1;
	  p = p+i+1;
	  break;
	}
    }
    lj_buf_putmem(sb, p, len);
  } else {
    lj_buf_putmem(sb, "[string]", 8);
  }
  return 1;
}